

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprPhraseCollist(Fts5Expr *pExpr,int iPhrase,u8 **ppCollist,int *pnCollist)

{
  long *plVar1;
  undefined4 *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  Fts5Buffer *pBuf;
  Fts5ExprTerm *pTerm;
  int *in_stack_00000010;
  int rc;
  Fts5ExprNode *pNode;
  Fts5ExprPhrase *pPhrase;
  int local_34;
  
  plVar1 = *(long **)(*(long *)(in_RDI + 0x20) + (long)in_ESI * 8);
  local_34 = 0;
  if (((*(int *)(*plVar1 + 4) == 0) &&
      (*(long *)(*plVar1 + 0x18) == *(long *)(*(long *)(in_RDI + 0x10) + 0x18))) &&
     (0 < (int)plVar1[2])) {
    if (plVar1[8] == 0) {
      *in_RDX = *(undefined8 *)(plVar1[7] + 8);
      *in_RCX = *(undefined4 *)(plVar1[7] + 0x10);
    }
    else {
      local_34 = fts5ExprSynonymList((Fts5ExprTerm *)ppCollist,(i64)pnCollist,(Fts5Buffer *)pPhrase,
                                     (u8 **)pNode,in_stack_00000010);
    }
  }
  else {
    *in_RDX = 0;
    *in_RCX = 0;
  }
  return local_34;
}

Assistant:

static int sqlite3Fts5ExprPhraseCollist(
  Fts5Expr *pExpr,
  int iPhrase,
  const u8 **ppCollist,
  int *pnCollist
){
  Fts5ExprPhrase *pPhrase = pExpr->apExprPhrase[iPhrase];
  Fts5ExprNode *pNode = pPhrase->pNode;
  int rc = SQLITE_OK;

  assert( iPhrase>=0 && iPhrase<pExpr->nPhrase );
  assert( pExpr->pConfig->eDetail==FTS5_DETAIL_COLUMNS );

  if( pNode->bEof==0
   && pNode->iRowid==pExpr->pRoot->iRowid
   && pPhrase->poslist.n>0
  ){
    Fts5ExprTerm *pTerm = &pPhrase->aTerm[0];
    if( pTerm->pSynonym ){
      Fts5Buffer *pBuf = (Fts5Buffer*)&pTerm->pSynonym[1];
      rc = fts5ExprSynonymList(
          pTerm, pNode->iRowid, pBuf, (u8**)ppCollist, pnCollist
      );
    }else{
      *ppCollist = pPhrase->aTerm[0].pIter->pData;
      *pnCollist = pPhrase->aTerm[0].pIter->nData;
    }
  }else{
    *ppCollist = 0;
    *pnCollist = 0;
  }

  return rc;
}